

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Serializer::CloseStream
          (BP3Serializer *this,IO *io,size_t *metadataStart,size_t *metadataCount,bool addMetadata)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long lVar3;
  iterator iVar4;
  undefined8 uVar5;
  key_type local_90;
  string local_70;
  string local_50;
  
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"buffering","");
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((&(this->super_BP3Base).field_0x1c0)[(long)(this->super_BP3Base)._vptr_BP3Base[-3]] == '\x01')
  {
    SerializeDataBuffer(this,io);
  }
  *metadataStart =
       *(size_t *)
        (&(this->super_BP3Base).field_0x60 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]);
  SerializeMetadataInData(this,false,addMetadata);
  pp_Var2 = (this->super_BP3Base)._vptr_BP3Base;
  *metadataCount = *(long *)(&(this->super_BP3Base).field_0x60 + (long)pp_Var2[-3]) - *metadataStart
  ;
  p_Var1 = pp_Var2[-3];
  if ((&(this->super_BP3Base).field_0x2e8)[(long)p_Var1] == '\x01') {
    lVar3 = *(long *)(&(this->super_BP3Base).field_0x60 + (long)p_Var1);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"buffering","");
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(&(this->super_BP3Base).field_0x2b0 + (long)p_Var1),&local_90);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar5 = std::__throw_out_of_range("_Map_base::at");
      _Unwind_Resume(uVar5);
    }
    *(long *)((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur + 0x28) =
         *(long *)((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                         ._M_cur + 0x28) + lVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"buffering","");
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BP3Serializer::CloseStream(core::IO &io, size_t &metadataStart, size_t &metadataCount,
                                const bool addMetadata)
{

    m_Profiler.Start("buffering");
    if (m_MetadataSet.DataPGIsOpen)
    {
        SerializeDataBuffer(io);
    }

    metadataStart = m_Data.m_Position;

    SerializeMetadataInData(false, addMetadata);

    metadataCount = m_Data.m_Position - metadataStart;

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.at("buffering") += m_Data.m_Position;
    }
    m_Profiler.Stop("buffering");
}